

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O1

SamProgram * __thiscall
BamTools::SamProgramChain::operator[](SamProgramChain *this,string *programId)

{
  pointer pSVar1;
  int iVar2;
  BamException *this_00;
  ulong uVar3;
  ulong uVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = IndexOf(this,programId);
  pSVar1 = (this->m_data).
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_data).
                 super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
          -0x7b425ed097b425ed;
  if (iVar2 == (int)uVar3) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"SamProgramChain::operator[]","");
    std::operator+(&local_40,"unknown programId: ",programId);
    Internal::BamException::BamException(this_00,&local_60,&local_40);
    __cxa_throw(this_00,&Internal::BamException::typeinfo,Internal::BamException::~BamException);
  }
  uVar4 = (ulong)iVar2;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    return pSVar1 + uVar4;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

SamProgram& SamProgramChain::operator[](const std::string& programId)
{

    // look up program record matching this ID
    int index = IndexOf(programId);

    // if record not found
    if (index == (int)m_data.size()) {
        throw Internal::BamException("SamProgramChain::operator[]",
                                     "unknown programId: " + programId);
    }

    // otherwise return program record at index
    return m_data.at(index);
}